

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O3

void checkSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *soplex)

{
  double dVar1;
  undefined4 uVar2;
  undefined8 *puVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  Verbosity old_verbosity;
  Verbosity VVar8;
  char *pcVar9;
  ostream *poVar10;
  data_type *pdVar11;
  longdouble lVar12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxviol_2;
  Rational rowviol;
  Rational sumviol;
  Rational maxviol;
  Rational boundviol;
  true_ local_1b9;
  data_type local_1b8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  ulong local_198;
  undefined4 local_190;
  undefined4 uStack_18c;
  int local_188;
  undefined1 uStack_184;
  char cStack_183;
  char cStack_182;
  undefined1 uStack_181;
  data_type local_178;
  undefined8 local_168;
  undefined5 uStack_160;
  undefined3 uStack_15b;
  uint local_158;
  undefined4 uStack_154;
  undefined4 local_150;
  uint uStack_14c;
  undefined8 local_148;
  data_type local_138;
  undefined8 local_128;
  undefined5 uStack_120;
  undefined3 uStack_11b;
  uint local_118;
  undefined4 uStack_114;
  undefined4 local_110;
  uint uStack_10c;
  undefined8 local_108;
  data_type local_f8;
  undefined8 local_e8;
  undefined5 uStack_e0;
  undefined3 uStack_db;
  uint local_d8;
  undefined1 uStack_d4;
  undefined3 uStack_d3;
  undefined5 local_d0;
  undefined3 uStack_cb;
  undefined8 local_c8;
  data_type local_b8;
  undefined8 local_a8;
  undefined5 uStack_a0;
  undefined3 uStack_9b;
  uint local_98;
  undefined4 uStack_94;
  undefined4 local_90;
  uint uStack_8c;
  undefined8 local_88;
  double local_78;
  double local_70;
  data_type local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  ulong local_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  iVar5 = soplex->_currentSettings->_intParamValues[0x12];
  if ((iVar5 == 2) || ((iVar5 == 1 && (soplex->_currentSettings->_intParamValues[0x10] == 1)))) {
    if ((soplex->_hasSolReal == false) && ((soplex->_hasSolRational & 1U) == 0)) {
      VVar8 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar8) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"No primal solution available.\n",0x1e);
        (soplex->spxout).m_verbosity = VVar8;
      }
    }
    else {
      local_b8.la[0] = 0;
      local_a8 = CONCAT17(local_a8._7_1_,0x10000000001);
      local_98 = 1;
      uStack_94 = 0;
      local_88 = CONCAT17(local_88._7_1_,0x10000000001);
      local_178.la[0] = 0;
      local_168 = CONCAT17(local_168._7_1_,0x10000000001);
      local_158 = 1;
      uStack_154 = 0;
      local_148 = CONCAT17(local_148._7_1_,0x10000000001);
      local_138.la[0] = 0;
      local_128 = CONCAT17(local_128._7_1_,0x10000000001);
      local_118 = 1;
      uStack_114 = 0;
      local_108 = CONCAT17(local_108._7_1_,0x10000000001);
      bVar4 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getBoundViolationRational(soplex,(Rational *)&local_b8.ld,(Rational *)&local_138.ld)
      ;
      if (bVar4) {
        bVar4 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getRowViolationRational
                          (soplex,(Rational *)&local_178.ld,(Rational *)&local_138.ld);
        if (!bVar4) goto LAB_00339def;
        VVar8 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar8) {
          (soplex->spxout).m_verbosity = INFO1;
          iVar5 = boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_b8.ld,
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_178.ld);
          pdVar11 = &local_178;
          if (0 < iVar5) {
            pdVar11 = &local_b8;
          }
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_f8.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&pdVar11->ld);
          dVar1 = soplex->_currentSettings->_realParamValues[0];
          if (NAN(dVar1)) {
            pcVar9 = "infeasible";
          }
          else {
            lVar12 = (longdouble)dVar1;
            local_1b8.ld.capacity = SUB104(lVar12,0);
            local_1b8.la[0]._4_4_ = (undefined4)((unkuint10)lVar12 >> 0x20);
            local_1b8.la[1]._0_2_ = (undefined2)((unkuint10)lVar12 >> 0x40);
            local_70 = dVar1;
            bVar4 = boost::multiprecision::default_ops::
                    eval_gt_imp<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,long_double>
                              ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)&local_f8.ld,(longdouble *)&local_1b8,(true_ *)&local_68.ld);
            pcVar9 = "feasible";
            if (bVar4) {
              pcVar9 = "infeasible";
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"Primal solution ",
                     0x10);
          poVar10 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          sVar6 = strlen(pcVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar9,sVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     " in original problem (max. violation = ",0x27);
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_1b8.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_f8.ld);
          boost::multiprecision::operator<<
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)&local_1b8.ld);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],").\n",3);
          if ((cStack_183 == '\0') && (cStack_182 == '\0')) {
            operator_delete((void *)CONCAT44(uStack_18c,local_190),(local_198 & 0xffffffff) << 3);
          }
          if ((local_1a8._5_1_ == '\0') && (local_1a8._6_1_ == '\0')) {
            operator_delete((void *)CONCAT62(local_1b8.la[1]._2_6_,local_1b8.la[1]._0_2_),
                            (ulong)local_1b8.ld.capacity << 3);
          }
          (soplex->spxout).m_verbosity = VVar8;
          if ((local_c8._5_1_ == '\0') && (local_c8._6_1_ == '\0')) {
            operator_delete((void *)CONCAT35(uStack_cb,local_d0),(ulong)local_d8 << 3);
          }
          if ((local_e8._5_1_ == '\0') && (local_e8._6_1_ == '\0')) {
            operator_delete(local_f8.ld.data,(local_f8.la[0] & 0xffffffff) << 3);
          }
        }
      }
      else {
LAB_00339def:
        VVar8 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar8) {
          (soplex->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[3],"Could not check primal solution.\n",0x21);
          (soplex->spxout).m_verbosity = VVar8;
        }
      }
      if ((local_108._5_1_ == '\0') && (local_108._6_1_ == '\0')) {
        operator_delete((void *)CONCAT44(uStack_10c,local_110),(ulong)local_118 << 3);
      }
      if ((local_128._5_1_ == '\0') && (local_128._6_1_ == '\0')) {
        operator_delete(local_138.ld.data,(local_138.la[0] & 0xffffffff) << 3);
      }
      if ((local_148._5_1_ == '\0') && (local_148._6_1_ == '\0')) {
        operator_delete((void *)CONCAT44(uStack_14c,local_150),(ulong)local_158 << 3);
      }
      if ((local_168._5_1_ == '\0') && (local_168._6_1_ == '\0')) {
        operator_delete(local_178.ld.data,(local_178.la[0] & 0xffffffff) << 3);
      }
      if ((local_88._5_1_ == '\0') && (local_88._6_1_ == '\0')) {
        operator_delete((void *)CONCAT44(uStack_8c,local_90),(ulong)local_98 << 3);
      }
      if ((local_a8._5_1_ == '\0') && (local_a8._6_1_ == '\0')) {
        operator_delete(local_b8.ld.data,(local_b8.la[0] & 0xffffffff) << 3);
      }
    }
    if ((soplex->_hasSolReal != false) || ((soplex->_hasSolRational & 1U) != 0)) {
      local_b8.la[0] = 0;
      local_a8 = CONCAT17(local_a8._7_1_,0x10000000001);
      local_98 = 1;
      uStack_94 = 0;
      local_88 = CONCAT17(local_88._7_1_,0x10000000001);
      local_178.la[0] = 0;
      local_168 = CONCAT17(local_168._7_1_,0x10000000001);
      local_158 = 1;
      uStack_154 = 0;
      local_148 = CONCAT17(local_148._7_1_,0x10000000001);
      local_138.la[0] = 0;
      local_128 = CONCAT17(local_128._7_1_,0x10000000001);
      local_118 = 1;
      uStack_114 = 0;
      local_108 = CONCAT17(local_108._7_1_,0x10000000001);
      bVar4 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getRedCostViolationRational
                        (soplex,(Rational *)&local_b8.ld,(Rational *)&local_138.ld);
      if (bVar4) {
        bVar4 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getDualViolationRational
                          (soplex,(Rational *)&local_178.ld,(Rational *)&local_138.ld);
        if (!bVar4) goto LAB_0033a1ce;
        VVar8 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar8) {
          (soplex->spxout).m_verbosity = INFO1;
          iVar5 = boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_b8.ld,
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_178.ld);
          pdVar11 = &local_178;
          if (0 < iVar5) {
            pdVar11 = &local_b8;
          }
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_f8.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&pdVar11->ld);
          dVar1 = soplex->_currentSettings->_realParamValues[1];
          if (NAN(dVar1)) {
            pcVar9 = "infeasible";
          }
          else {
            lVar12 = (longdouble)dVar1;
            local_68.ld.capacity = SUB104(lVar12,0);
            local_68.la[0]._4_4_ = (undefined4)((unkuint10)lVar12 >> 0x20);
            local_68.la[1]._0_2_ = (undefined2)((unkuint10)lVar12 >> 0x40);
            local_78 = dVar1;
            bVar4 = boost::multiprecision::default_ops::
                    eval_gt_imp<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,long_double>
                              ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)&local_f8.ld,(longdouble *)&local_68,&local_1b9);
            pcVar9 = "feasible";
            if (bVar4) {
              pcVar9 = "infeasible";
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"Dual solution ",0xe);
          poVar10 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          sVar6 = strlen(pcVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar9,sVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     " in original problem (max. violation = ",0x27);
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_68.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_f8.ld);
          boost::multiprecision::operator<<
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)&local_68.ld);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],").\n",3);
          if ((local_38._5_1_ == '\0') && (local_38._6_1_ == '\0')) {
            operator_delete((void *)CONCAT44(uStack_3c,local_40),(local_48 & 0xffffffff) << 3);
          }
          if ((local_58._5_1_ == '\0') && (local_58._6_1_ == '\0')) {
            operator_delete((void *)CONCAT62(local_68.la[1]._2_6_,local_68.la[1]._0_2_),
                            (ulong)local_68.ld.capacity << 3);
          }
          (soplex->spxout).m_verbosity = VVar8;
          if ((local_c8._5_1_ == '\0') && (local_c8._6_1_ == '\0')) {
            operator_delete((void *)CONCAT35(uStack_cb,local_d0),(ulong)local_d8 << 3);
          }
          if ((local_e8._5_1_ == '\0') && (local_e8._6_1_ == '\0')) {
            operator_delete(local_f8.ld.data,(local_f8.la[0] & 0xffffffff) << 3);
          }
        }
      }
      else {
LAB_0033a1ce:
        VVar8 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar8) {
          (soplex->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[3],"Could not check dual solution.\n",0x1f);
          (soplex->spxout).m_verbosity = VVar8;
        }
      }
      if ((local_108._5_1_ == '\0') && (local_108._6_1_ == '\0')) {
        operator_delete((void *)CONCAT44(uStack_10c,local_110),(ulong)local_118 << 3);
      }
      if ((local_128._5_1_ == '\0') && (local_128._6_1_ == '\0')) {
        operator_delete(local_138.ld.data,(local_138.la[0] & 0xffffffff) << 3);
      }
      if ((local_148._5_1_ == '\0') && (local_148._6_1_ == '\0')) {
        operator_delete((void *)CONCAT44(uStack_14c,local_150),(ulong)local_158 << 3);
      }
      if ((local_168._5_1_ == '\0') && (local_168._6_1_ == '\0')) {
        operator_delete(local_178.ld.data,(local_178.la[0] & 0xffffffff) << 3);
      }
      if ((local_88._5_1_ == '\0') && (local_88._6_1_ == '\0')) {
        operator_delete((void *)CONCAT44(uStack_8c,local_90),(ulong)local_98 << 3);
      }
      if ((local_a8._5_1_ == '\0') && (local_a8._6_1_ == '\0')) {
        operator_delete(local_b8.ld.data,(local_b8.la[0] & 0xffffffff) << 3);
      }
      VVar8 = (soplex->spxout).m_verbosity;
      goto LAB_0033a7bd;
    }
    VVar8 = (soplex->spxout).m_verbosity;
LAB_0033a4b4:
    if ((int)VVar8 < 3) goto LAB_0033a7bd;
    (soplex->spxout).m_verbosity = INFO1;
    poVar10 = (soplex->spxout).m_streams[3];
    pcVar9 = "No dual solution available.\n";
    lVar7 = 0x1c;
  }
  else {
    if ((soplex->_hasSolReal == false) && ((soplex->_hasSolRational & 1U) == 0)) {
      VVar8 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar8) {
        (soplex->spxout).m_verbosity = INFO1;
        poVar10 = (soplex->spxout).m_streams[3];
        pcVar9 = "No primal solution available.\n";
        lVar7 = 0x1e;
LAB_0033a49a:
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar9,lVar7);
        (soplex->spxout).m_verbosity = VVar8;
      }
    }
    else {
      local_148 = 0xa00000000;
      local_178.la[0] = 0;
      local_178.ld.data = (limb_pointer)0x0;
      local_168 = 0;
      uStack_160 = 0;
      uStack_15b = 0;
      local_158 = 0;
      uStack_154 = 0;
      local_150 = 0;
      uStack_14c = uStack_14c & 0xffffff00;
      local_108 = 0xa00000000;
      local_138.la[0] = 0;
      local_138.ld.data = (limb_pointer)0x0;
      local_128 = 0;
      uStack_120 = 0;
      uStack_11b = 0;
      local_118 = 0;
      uStack_114 = 0;
      local_110 = 0;
      uStack_10c = uStack_10c & 0xffffff00;
      local_c8 = 0xa00000000;
      local_f8.la[0] = 0;
      local_f8.ld.data = (limb_pointer)0x0;
      local_e8 = 0;
      uStack_e0 = 0;
      uStack_db = 0;
      local_d8 = 0;
      uStack_d4 = 0;
      uStack_d3 = 0;
      local_d0 = 0;
      bVar4 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getBoundViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_178.ld,
                                  (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_f8.ld);
      if (bVar4) {
        bVar4 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getRowViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_138.ld,
                                  (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_f8.ld);
        if (bVar4) {
          VVar8 = (soplex->spxout).m_verbosity;
          if ((int)VVar8 < 3) goto LAB_0033a4a2;
          (soplex->spxout).m_verbosity = INFO1;
          if ((int)local_108 == 2 || (int)local_148 == 2) {
LAB_0033a2fe:
            puVar3 = &local_108;
            local_198 = CONCAT44(uStack_114,local_118);
            uStack_1a0 = CONCAT35(uStack_11b,uStack_120);
            local_1a8 = local_128;
            local_1b8.ld.capacity = (uint)local_138.la[0];
            local_1b8.la[0]._4_4_ = (undefined4)((ulong)local_138._0_8_ >> 0x20);
            local_1b8.la[1]._0_2_ = (undefined2)local_138.la[1];
            local_1b8.la[1]._2_6_ = (undefined6)((ulong)local_138._8_8_ >> 0x10);
            local_190 = local_110;
            uStack_18c = CONCAT31(uStack_18c._1_3_,(undefined1)uStack_10c);
            local_188 = (int)local_108;
          }
          else {
            iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              ((cpp_dec_float<50U,_int,_void> *)&local_178.ld,
                               (cpp_dec_float<50U,_int,_void> *)&local_138.ld);
            if (iVar5 < 1) {
              goto LAB_0033a2fe;
            }
            puVar3 = &local_148;
            local_198 = CONCAT44(uStack_154,local_158);
            uStack_1a0 = CONCAT35(uStack_15b,uStack_160);
            local_1a8 = local_168;
            local_1b8.ld.capacity = (uint)local_178.la[0];
            local_1b8.la[0]._4_4_ = (undefined4)((ulong)local_178._0_8_ >> 0x20);
            local_1b8.la[1]._0_2_ = (undefined2)local_178.la[1];
            local_1b8.la[1]._2_6_ = (undefined6)((ulong)local_178._8_8_ >> 0x10);
            local_190 = local_150;
            uStack_18c = CONCAT31(uStack_18c._1_3_,(undefined1)uStack_14c);
            local_188 = (int)local_148;
          }
          uVar2 = *(undefined4 *)((long)puVar3 + 4);
          uStack_184 = (undefined1)uVar2;
          cStack_183 = (char)((uint)uVar2 >> 8);
          cStack_182 = (char)((uint)uVar2 >> 0x10);
          uStack_181 = (undefined1)((uint)uVar2 >> 0x18);
          pcVar9 = "infeasible";
          if ((local_188 != 2) &&
             (dVar1 = soplex->_currentSettings->_realParamValues[0], !NAN(dVar1))) {
            local_88 = 0xa00000000;
            local_b8.la[0] = 0;
            local_b8.ld.data = (limb_pointer)0x0;
            local_a8 = 0;
            uStack_a0 = 0;
            uStack_9b = 0;
            local_98 = 0;
            uStack_94 = 0;
            local_90 = 0;
            uStack_8c = uStack_8c & 0xffffff00;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_b8.ld,dVar1);
            iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              ((cpp_dec_float<50U,_int,_void> *)&local_1b8.ld,
                               (cpp_dec_float<50U,_int,_void> *)&local_b8.ld);
            pcVar9 = "infeasible";
            if (iVar5 < 1) {
              pcVar9 = "feasible";
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"Primal solution ",
                     0x10);
          poVar10 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          sVar6 = strlen(pcVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar9,sVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     " in original problem (max. violation = ",0x27);
          poVar10 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) =
               *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) & 0xfffffefb | 0x100;
          local_48 = local_198;
          local_58 = local_1a8;
          uStack_50 = uStack_1a0;
          local_68.ld.capacity = local_1b8.ld.capacity;
          local_68.la[0]._4_4_ = local_1b8.la[0]._4_4_;
          local_68.la[1]._0_2_ = local_1b8.la[1]._0_2_;
          local_68.la[1]._2_6_ = local_1b8.la[1]._2_6_;
          local_40 = local_190;
          uStack_3c = CONCAT31(uStack_3c._1_3_,(undefined1)uStack_18c);
          local_38 = CONCAT17(uStack_181,
                              CONCAT16(cStack_182,
                                       CONCAT15(cStack_183,CONCAT14(uStack_184,local_188))));
          boost::multiprecision::operator<<
                    (poVar10,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_68.ld);
          poVar10 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          lVar7 = *(long *)poVar10;
          *(undefined8 *)(poVar10 + *(long *)(lVar7 + -0x18) + 8) = 8;
          lVar7 = *(long *)(lVar7 + -0x18);
          *(uint *)(poVar10 + lVar7 + 0x18) = *(uint *)(poVar10 + lVar7 + 0x18) & 0xfffffefb | 4;
          pcVar9 = ").\n";
          lVar7 = 3;
          goto LAB_0033a49a;
        }
      }
      VVar8 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar8) {
        (soplex->spxout).m_verbosity = INFO1;
        poVar10 = (soplex->spxout).m_streams[3];
        pcVar9 = "Could not check primal solution.\n";
        lVar7 = 0x21;
        goto LAB_0033a49a;
      }
    }
LAB_0033a4a2:
    if ((soplex->_hasSolReal == false) && ((soplex->_hasSolRational & 1U) == 0)) goto LAB_0033a4b4;
    local_148 = 0xa00000000;
    local_178.la[0] = 0;
    local_178.ld.data = (limb_pointer)0x0;
    local_168 = 0;
    uStack_160 = 0;
    uStack_15b = 0;
    local_158 = 0;
    uStack_154 = 0;
    local_150 = 0;
    uStack_14c = uStack_14c & 0xffffff00;
    local_108 = 0xa00000000;
    local_138.la[0] = 0;
    local_138.ld.data = (limb_pointer)0x0;
    local_128 = 0;
    uStack_120 = 0;
    uStack_11b = 0;
    local_118 = 0;
    uStack_114 = 0;
    local_110 = 0;
    uStack_10c = uStack_10c & 0xffffff00;
    local_c8 = 0xa00000000;
    local_f8.la[0] = 0;
    local_f8.ld.data = (limb_pointer)0x0;
    local_e8 = 0;
    uStack_e0 = 0;
    uStack_db = 0;
    local_d8 = 0;
    uStack_d4 = 0;
    uStack_d3 = 0;
    local_d0 = 0;
    bVar4 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::getRedCostViolation
                      (soplex,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_178.ld,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_f8.ld);
    if (bVar4) {
      bVar4 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getDualViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)&local_138.ld,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_f8.ld);
      if (!bVar4) goto LAB_0033a5e6;
      VVar8 = (soplex->spxout).m_verbosity;
      if ((int)VVar8 < 3) goto LAB_0033a7bd;
      (soplex->spxout).m_verbosity = INFO1;
      if ((int)local_108 == 2 || (int)local_148 == 2) {
LAB_0033a619:
        puVar3 = &local_108;
        local_198 = CONCAT44(uStack_114,local_118);
        uStack_1a0 = CONCAT35(uStack_11b,uStack_120);
        local_1a8 = local_128;
        local_1b8.ld.capacity = (uint)local_138.la[0];
        local_1b8.la[0]._4_4_ = (undefined4)((ulong)local_138._0_8_ >> 0x20);
        local_1b8.la[1]._0_2_ = (undefined2)local_138.la[1];
        local_1b8.la[1]._2_6_ = (undefined6)((ulong)local_138._8_8_ >> 0x10);
        local_190 = local_110;
        uStack_18c = CONCAT31(uStack_18c._1_3_,(undefined1)uStack_10c);
        local_188 = (int)local_108;
      }
      else {
        iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          ((cpp_dec_float<50U,_int,_void> *)&local_178.ld,
                           (cpp_dec_float<50U,_int,_void> *)&local_138.ld);
        if (iVar5 < 1) {
          goto LAB_0033a619;
        }
        puVar3 = &local_148;
        local_198 = CONCAT44(uStack_154,local_158);
        uStack_1a0 = CONCAT35(uStack_15b,uStack_160);
        local_1a8 = local_168;
        local_1b8.ld.capacity = (uint)local_178.la[0];
        local_1b8.la[0]._4_4_ = (undefined4)((ulong)local_178._0_8_ >> 0x20);
        local_1b8.la[1]._0_2_ = (undefined2)local_178.la[1];
        local_1b8.la[1]._2_6_ = (undefined6)((ulong)local_178._8_8_ >> 0x10);
        local_190 = local_150;
        uStack_18c = CONCAT31(uStack_18c._1_3_,(undefined1)uStack_14c);
        local_188 = (int)local_148;
      }
      uVar2 = *(undefined4 *)((long)puVar3 + 4);
      uStack_184 = (undefined1)uVar2;
      cStack_183 = (char)((uint)uVar2 >> 8);
      cStack_182 = (char)((uint)uVar2 >> 0x10);
      uStack_181 = (undefined1)((uint)uVar2 >> 0x18);
      pcVar9 = "infeasible";
      if ((local_188 != 2) && (dVar1 = soplex->_currentSettings->_realParamValues[1], !NAN(dVar1)))
      {
        local_88 = 0xa00000000;
        local_b8.la[0] = 0;
        local_b8.ld.data = (limb_pointer)0x0;
        local_a8 = 0;
        uStack_a0 = 0;
        uStack_9b = 0;
        local_98 = 0;
        uStack_94 = 0;
        local_90 = 0;
        uStack_8c = uStack_8c & 0xffffff00;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_b8.ld,dVar1);
        iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          ((cpp_dec_float<50U,_int,_void> *)&local_1b8.ld,
                           (cpp_dec_float<50U,_int,_void> *)&local_b8.ld);
        pcVar9 = "infeasible";
        if (iVar5 < 1) {
          pcVar9 = "feasible";
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"Dual solution ",0xe);
      poVar10 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
      sVar6 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar9,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                 " in original problem (max. violation = ",0x27);
      poVar10 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
      *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) =
           *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) & 0xfffffefb | 0x100;
      local_98 = (uint)local_198;
      uStack_94 = (undefined4)(local_198 >> 0x20);
      local_b8.la[0] = CONCAT44(local_1b8.la[0]._4_4_,local_1b8.ld.capacity);
      local_b8.la[1] = CONCAT62(local_1b8.la[1]._2_6_,local_1b8.la[1]._0_2_);
      local_a8 = local_1a8;
      uStack_a0 = (undefined5)uStack_1a0;
      uStack_9b = (undefined3)((ulong)uStack_1a0 >> 0x28);
      local_90 = local_190;
      uStack_8c = CONCAT31(uStack_8c._1_3_,(undefined1)uStack_18c);
      local_88 = CONCAT17(uStack_181,
                          CONCAT16(cStack_182,CONCAT15(cStack_183,CONCAT14(uStack_184,local_188))));
      boost::multiprecision::operator<<
                (poVar10,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_b8.ld);
      poVar10 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
      lVar7 = *(long *)poVar10;
      *(undefined8 *)(poVar10 + *(long *)(lVar7 + -0x18) + 8) = 8;
      lVar7 = *(long *)(lVar7 + -0x18);
      *(uint *)(poVar10 + lVar7 + 0x18) = *(uint *)(poVar10 + lVar7 + 0x18) & 0xfffffefb | 4;
      pcVar9 = ").\n";
      lVar7 = 3;
    }
    else {
LAB_0033a5e6:
      VVar8 = (soplex->spxout).m_verbosity;
      if ((int)VVar8 < 3) goto LAB_0033a7bd;
      (soplex->spxout).m_verbosity = INFO1;
      poVar10 = (soplex->spxout).m_streams[3];
      pcVar9 = "Could not check dual solution.\n";
      lVar7 = 0x1f;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar9,lVar7);
  (soplex->spxout).m_verbosity = VVar8;
LAB_0033a7bd:
  if (2 < (int)VVar8) {
    (soplex->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>((soplex->spxout).m_streams[3],"\n",1);
    (soplex->spxout).m_verbosity = VVar8;
  }
  return;
}

Assistant:

void checkSolution(SoPlexBase<R>& soplex)
{
   if(soplex.intParam(SoPlexBase<R>::CHECKMODE) == SoPlexBase<R>::CHECKMODE_RATIONAL
         || (soplex.intParam(SoPlexBase<R>::CHECKMODE) == SoPlexBase<R>::CHECKMODE_AUTO
             && soplex.intParam(SoPlexBase<R>::READMODE) == SoPlexBase<R>::READMODE_RATIONAL))
   {
      checkSolutionRational(soplex);
   }
   else
   {
      checkSolutionReal(soplex);
   }

   SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\n");
}